

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy_dedicatedDictSearch_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  U32 UVar2;
  ZSTD_matchState_t *pZVar3;
  U32 *pUVar4;
  seqDef *psVar5;
  undefined8 uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  int *piVar11;
  BYTE *pBVar12;
  uint uVar13;
  int *piVar14;
  ulong uVar15;
  ulong uVar16;
  BYTE *pBVar17;
  int *piVar18;
  int *ip;
  ulong uVar19;
  seqStore_t *psVar20;
  int *ip_00;
  long lVar21;
  size_t ofbCandidate;
  uint local_100;
  uint local_fc;
  BYTE *local_f8;
  uint local_f0;
  uint local_ec;
  ZSTD_matchState_t *local_e8;
  size_t local_e0;
  int *local_d8;
  ulong local_d0;
  uint local_c4;
  int *local_c0;
  int *local_b8;
  int *local_b0;
  uint local_a4;
  seqStore_t *local_a0;
  BYTE *local_98;
  BYTE *local_90;
  int *local_88;
  int local_7c;
  int local_78;
  int local_74;
  int *local_70;
  BYTE *local_68;
  size_t local_60;
  BYTE *local_58;
  uint *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_f8 = (ms->window).base;
  local_ec = (ms->cParams).minMatch;
  if (5 < local_ec) {
    local_ec = 6;
  }
  if (local_ec < 5) {
    local_ec = 4;
  }
  local_c4 = (ms->cParams).searchLog;
  local_100 = 6;
  if (local_c4 < 6) {
    local_100 = local_c4;
  }
  local_a4 = (ms->window).dictLimit;
  local_d0 = (ulong)local_a4;
  if (local_100 < 5) {
    local_100 = 4;
  }
  local_98 = local_f8 + local_d0;
  pZVar3 = ms->dictMatchState;
  local_90 = (pZVar3->window).base;
  local_58 = local_90 + (pZVar3->window).dictLimit;
  local_b0 = (int *)(pZVar3->window).nextSrc;
  uVar7 = ((int)src - ((int)local_58 + (int)local_98)) + (int)local_b0;
  ip = (int *)((long)src + (ulong)(uVar7 == 0));
  local_fc = *rep;
  local_d8 = (int *)src;
  if (uVar7 < local_fc) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x603,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_f0 = rep[1];
  local_a0 = seqStore;
  local_50 = rep;
  if (uVar7 < local_f0) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x604,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iEnd = (int *)((long)src + srcSize);
  local_88 = (int *)((long)src + (srcSize - 0x10));
  local_a4 = ((int)local_90 - (int)local_b0) + local_a4;
  ms->lazySkipping = 0;
  uVar7 = ms->nextToUpdate;
  uVar15 = (ulong)uVar7;
  UVar2 = ms->rowHashLog;
  uVar13 = ((int)local_88 - (int)(local_f8 + uVar15)) + 1;
  if (7 < uVar13) {
    uVar13 = 8;
  }
  uVar9 = 0;
  if (local_f8 + uVar15 <= local_88) {
    uVar9 = uVar13;
  }
  pUVar4 = ms->hashTable;
  local_e0 = CONCAT44(local_e0._4_4_,UVar2 + 8);
  local_b8 = (int *)(ulong)(0x38 - UVar2);
  local_c0 = (int *)CONCAT44(local_c0._4_4_,0x18 - UVar2);
  local_60 = 1L << ((byte)local_100 & 0x3f);
  pBVar17 = ms->tagTable;
  local_e8 = ms;
  for (; uVar15 < uVar9 + uVar7; uVar15 = uVar15 + 1) {
    if (0x20 < (uint)local_e0) {
LAB_0064b1ec:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x353,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    uVar19 = local_e8->hashSalt;
    if (local_ec == 5) {
      uVar19 = (*(long *)(local_f8 + uVar15) * -0x30e4432345000000 ^ uVar19) >>
               ((byte)local_b8 & 0x3f);
    }
    else if (local_ec == 6) {
      uVar19 = (*(long *)(local_f8 + uVar15) * -0x30e4432340650000 ^ uVar19) >>
               ((byte)local_b8 & 0x3f);
    }
    else {
      uVar19 = (ulong)((*(int *)(local_f8 + uVar15) * -0x61c8864f ^ (uint)uVar19) >>
                      ((byte)local_c0 & 0x1f));
    }
    uVar13 = ((uint)(uVar19 >> 8) & 0xffffff) << ((byte)local_100 & 0x1f);
    if (((ulong)(pUVar4 + uVar13) & 0x3f) != 0) {
LAB_0064b20b:
      __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                    ,0x32e,"void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)"
                   );
    }
    iVar8 = ZSTD_isAligned(pBVar17 + uVar13,local_60);
    if (iVar8 == 0) {
LAB_0064b22a:
      __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                    ,0x32f,"void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)"
                   );
    }
    local_e8->hashCache[(uint)uVar15 & 7] = (U32)uVar19;
  }
  local_68 = local_90 + -(ulong)local_a4;
  local_70 = iEnd + -8;
  iVar8 = (int)local_f8;
  local_74 = (1 - (int)local_d0) - iVar8;
  local_7c = -iVar8;
  local_78 = ((((int)local_b0 - (int)local_d0) - (int)local_90) - iVar8) + 1;
  psVar20 = local_a0;
  uVar7 = local_100;
  uVar13 = local_f0;
  piVar18 = local_d8;
  do {
    while( true ) {
      local_d8 = piVar18;
      local_f0 = uVar13;
      if (local_88 <= ip) {
        *local_50 = local_fc;
        local_50[1] = local_f0;
        return (long)iEnd - (long)local_d8;
      }
      piVar18 = (int *)((long)ip + 1);
      iVar8 = (int)ip;
      uVar13 = ((iVar8 - (int)local_f8) - local_fc) + 1;
      piVar14 = (int *)(local_f8 + uVar13);
      if (uVar13 < (uint)local_d0) {
        piVar14 = (int *)(local_90 + (uVar13 - local_a4));
      }
      if ((uVar13 - (uint)local_d0 < 0xfffffffd) && (*piVar14 == *piVar18)) {
        piVar11 = iEnd;
        if (uVar13 < (uint)local_d0) {
          piVar11 = local_b0;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)ip + 5),(BYTE *)(piVar14 + 1),(BYTE *)iEnd,
                            (BYTE *)piVar11,local_98);
        uVar15 = sVar10 + 4;
      }
      else {
        uVar15 = 0;
      }
      ofbCandidate = 999999999;
      if (local_ec == 6) {
        if (uVar7 == 6) {
          uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                             (local_e8,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
        }
        else if (uVar7 == 5) {
          uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                             (local_e8,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
        }
        else {
          uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                             (local_e8,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
        }
      }
      else if (local_ec == 5) {
        if (uVar7 == 6) {
          uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                             (local_e8,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
        }
        else if (uVar7 == 5) {
          uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                             (local_e8,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
        }
        else {
          uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                             (local_e8,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
        }
      }
      else if (uVar7 == 6) {
        uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                           (local_e8,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
      }
      else if (uVar7 == 5) {
        uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                           (local_e8,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
      }
      else {
        uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                           (local_e8,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
      }
      uVar16 = uVar15;
      if (uVar15 < uVar19) {
        uVar16 = uVar19;
      }
      if (3 < uVar16) break;
      uVar15 = (long)ip - (long)local_d8;
      ip = (int *)((long)ip + (uVar15 >> 8) + 1);
      local_e8->lazySkipping = (uint)(0x7ff < uVar15);
      uVar13 = local_f0;
      piVar18 = local_d8;
    }
    local_e0 = 1;
    if (uVar15 < uVar19) {
      piVar18 = ip;
      local_e0 = ofbCandidate;
    }
    local_38 = (ulong)((local_74 - local_fc) + iVar8);
    local_40 = (ulong)((local_7c - local_fc) + iVar8);
    local_48 = (ulong)((local_78 - local_fc) + iVar8);
    piVar14 = ip;
    for (lVar21 = 0; (int *)((long)ip + lVar21) < local_88; lVar21 = lVar21 + 1) {
      ip_00 = (int *)((long)ip + lVar21 + 1);
      iVar8 = (int)lVar21;
      uVar7 = (int)local_40 + iVar8 + 1;
      piVar11 = (int *)(local_f8 + uVar7);
      if (uVar7 < (uint)local_d0) {
        piVar11 = (int *)(local_90 + (uint)((int)local_48 + iVar8));
      }
      local_c0 = piVar18;
      local_b8 = piVar14;
      if (((uint)((int)local_38 + iVar8) < 0xfffffffd) && (*piVar11 == *ip_00)) {
        piVar18 = iEnd;
        if (uVar7 < (uint)local_d0) {
          piVar18 = local_b0;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)ip + lVar21 + 5),(BYTE *)(piVar11 + 1),(BYTE *)iEnd,
                            (BYTE *)piVar18,local_98);
        uVar7 = ZSTD_highbit32((U32)local_e0);
        if ((sVar10 < 0xfffffffffffffffc) &&
           ((int)(((int)uVar16 * 3 - uVar7) + 1) < (int)(sVar10 + 4) * 3)) {
          local_e0 = 1;
          uVar16 = sVar10 + 4;
          local_c0 = ip_00;
        }
      }
      ofbCandidate = 999999999;
      if (local_ec == 6) {
        if (local_100 == 6) {
          uVar15 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                             (local_e8,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
        }
        else if (local_100 == 5) {
          uVar15 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                             (local_e8,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
        }
        else {
          uVar15 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                             (local_e8,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
        }
      }
      else if (local_ec == 5) {
        if (local_100 == 6) {
          uVar15 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                             (local_e8,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
        }
        else if (local_100 == 5) {
          uVar15 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                             (local_e8,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
        }
        else {
          uVar15 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                             (local_e8,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
        }
      }
      else if (local_100 == 6) {
        uVar15 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                           (local_e8,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
      }
      else if (local_100 == 5) {
        uVar15 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                           (local_e8,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
      }
      else {
        uVar15 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                           (local_e8,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
      }
      sVar10 = ofbCandidate;
      uVar13 = ZSTD_highbit32((U32)ofbCandidate);
      uVar9 = ZSTD_highbit32((U32)local_e0);
      piVar18 = local_c0;
      psVar20 = local_a0;
      uVar7 = local_100;
      if ((uVar15 < 4) || ((int)((int)uVar15 * 4 - uVar13) <= (int)(((int)uVar16 * 4 - uVar9) + 4)))
      break;
      piVar14 = (int *)((long)local_b8 + 1);
      local_e0 = sVar10;
      uVar16 = uVar15;
      piVar18 = piVar14;
    }
    UVar2 = (U32)local_e0;
    if (3 < local_e0) {
      uVar15 = (long)piVar18 + (-(long)local_f8 - local_e0) + -0xfffffffd;
      pBVar12 = local_f8;
      pBVar17 = local_98;
      if ((uint)uVar15 < (uint)local_d0) {
        pBVar12 = local_68;
        pBVar17 = local_58;
      }
      pBVar12 = pBVar12 + (uVar15 & 0xffffffff);
      for (; ((local_d8 < piVar18 && (pBVar17 < pBVar12)) &&
             (*(BYTE *)((long)piVar18 + -1) == pBVar12[-1])); piVar18 = (int *)((long)piVar18 + -1))
      {
        pBVar12 = pBVar12 + -1;
        uVar16 = uVar16 + 1;
      }
      local_f0 = local_fc;
      local_fc = UVar2 - 3;
    }
    if (psVar20->maxNbSeq <= (ulong)((long)psVar20->sequences - (long)psVar20->sequencesStart >> 3))
    {
LAB_0064b249:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < psVar20->maxNbLit) {
LAB_0064b268:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar15 = (long)piVar18 - (long)local_d8;
    pBVar17 = psVar20->lit;
    if (psVar20->litStart + psVar20->maxNbLit < pBVar17 + uVar15) {
LAB_0064b287:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a0,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (iEnd < piVar18) {
LAB_0064b2a6:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a1,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    local_c0 = piVar18;
    if (local_70 < piVar18) {
      ZSTD_safecopyLiterals(pBVar17,(BYTE *)local_d8,(BYTE *)piVar18,(BYTE *)local_70);
LAB_0064adeb:
      psVar20->lit = psVar20->lit + uVar15;
      if (0xffff < uVar15) {
        if (psVar20->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2b2,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        psVar20->longLengthType = ZSTD_llt_literalLength;
        psVar20->longLengthPos =
             (U32)((ulong)((long)psVar20->sequences - (long)psVar20->sequencesStart) >> 3);
      }
    }
    else {
      uVar6 = *(undefined8 *)(local_d8 + 2);
      *(undefined8 *)pBVar17 = *(undefined8 *)local_d8;
      *(undefined8 *)(pBVar17 + 8) = uVar6;
      pBVar17 = psVar20->lit;
      if (0x10 < uVar15) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar17 + 0x10 + (-0x10 - (long)(local_d8 + 4))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                        ,0xe9,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar6 = *(undefined8 *)(local_d8 + 6);
        *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)(local_d8 + 4);
        *(undefined8 *)(pBVar17 + 0x18) = uVar6;
        if (0x20 < (long)uVar15) {
          lVar21 = 0;
          do {
            puVar1 = (undefined8 *)((long)local_d8 + lVar21 + 0x20);
            uVar6 = puVar1[1];
            pBVar12 = pBVar17 + lVar21 + 0x20;
            *(undefined8 *)pBVar12 = *puVar1;
            *(undefined8 *)(pBVar12 + 8) = uVar6;
            puVar1 = (undefined8 *)((long)local_d8 + lVar21 + 0x30);
            uVar6 = puVar1[1];
            *(undefined8 *)(pBVar12 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar12 + 0x18) = uVar6;
            lVar21 = lVar21 + 0x20;
          } while (pBVar12 + 0x20 < pBVar17 + uVar15);
        }
        goto LAB_0064adeb;
      }
      psVar20->lit = pBVar17 + uVar15;
    }
    psVar5 = psVar20->sequences;
    psVar5->litLength = (U16)uVar15;
    psVar5->offBase = UVar2;
    if (uVar16 < 3) {
LAB_0064b2c5:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,700,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < uVar16 - 3) {
      if (psVar20->longLengthType != ZSTD_llt_none) {
LAB_0064b2e4:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2bf,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      psVar20->longLengthType = ZSTD_llt_matchLength;
      psVar20->longLengthPos = (U32)((ulong)((long)psVar5 - (long)psVar20->sequencesStart) >> 3);
    }
    psVar5->mlBase = (U16)(uVar16 - 3);
    psVar20->sequences = psVar5 + 1;
    if (local_e8->lazySkipping != 0) {
      uVar7 = local_e8->nextToUpdate;
      uVar15 = (ulong)uVar7;
      UVar2 = local_e8->rowHashLog;
      uVar13 = ((int)local_88 - (int)(local_f8 + uVar15)) + 1;
      if (7 < uVar13) {
        uVar13 = 8;
      }
      if (local_88 < local_f8 + uVar15) {
        uVar13 = 0;
      }
      pUVar4 = local_e8->hashTable;
      pBVar17 = local_e8->tagTable;
      local_d8 = (int *)CONCAT44(local_d8._4_4_,UVar2 + 8);
      local_e0 = (size_t)(0x38 - UVar2);
      local_b8 = (int *)CONCAT44(local_b8._4_4_,0x18 - UVar2);
      for (; uVar15 < uVar13 + uVar7; uVar15 = uVar15 + 1) {
        if (0x20 < (uint)local_d8) goto LAB_0064b1ec;
        uVar19 = local_e8->hashSalt;
        if (local_ec == 5) {
          uVar19 = (*(long *)(local_f8 + uVar15) * -0x30e4432345000000 ^ uVar19) >>
                   ((byte)local_e0 & 0x3f);
        }
        else if (local_ec == 6) {
          uVar19 = (*(long *)(local_f8 + uVar15) * -0x30e4432340650000 ^ uVar19) >>
                   ((byte)local_e0 & 0x3f);
        }
        else {
          uVar19 = (ulong)((*(int *)(local_f8 + uVar15) * -0x61c8864f ^ (uint)uVar19) >>
                          ((byte)local_b8 & 0x1f));
        }
        uVar9 = ((uint)(uVar19 >> 8) & 0xffffff) << ((byte)local_100 & 0x1f);
        if (((ulong)(pUVar4 + uVar9) & 0x3f) != 0) goto LAB_0064b20b;
        iVar8 = ZSTD_isAligned(pBVar17 + uVar9,local_60);
        if (iVar8 == 0) goto LAB_0064b22a;
        local_e8->hashCache[(uint)uVar15 & 7] = (U32)uVar19;
      }
      local_e8->lazySkipping = 0;
      psVar20 = local_a0;
      uVar7 = local_100;
    }
    uVar9 = local_f0;
    for (ip = (int *)((long)local_c0 + uVar16); uVar13 = uVar9, piVar18 = ip, ip <= local_88;
        ip = (int *)((long)ip + sVar10 + 4)) {
      uVar9 = ((int)ip - (int)local_f8) - uVar13;
      pBVar17 = local_f8;
      if (uVar9 < (uint)local_d0) {
        pBVar17 = local_68;
      }
      if ((0xfffffffc < uVar9 - (uint)local_d0) || (*(int *)(pBVar17 + uVar9) != *ip)) break;
      piVar18 = iEnd;
      if (uVar9 < (uint)local_d0) {
        piVar18 = local_b0;
      }
      sVar10 = ZSTD_count_2segments
                         ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar17 + uVar9) + 4),(BYTE *)iEnd,
                          (BYTE *)piVar18,local_98);
      if (psVar20->maxNbSeq <=
          (ulong)((long)psVar20->sequences - (long)psVar20->sequencesStart >> 3)) goto LAB_0064b249;
      if (0x20000 < psVar20->maxNbLit) goto LAB_0064b268;
      pBVar17 = psVar20->lit;
      if (psVar20->litStart + psVar20->maxNbLit < pBVar17) goto LAB_0064b287;
      if (iEnd < ip) goto LAB_0064b2a6;
      if (local_70 < ip) {
        ZSTD_safecopyLiterals(pBVar17,(BYTE *)ip,(BYTE *)ip,(BYTE *)local_70);
      }
      else {
        uVar6 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar17 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar17 + 8) = uVar6;
      }
      psVar5 = psVar20->sequences;
      psVar5->litLength = 0;
      psVar5->offBase = 1;
      if (sVar10 + 4 < 3) goto LAB_0064b2c5;
      if (0xffff < sVar10 + 1) {
        if (psVar20->longLengthType != ZSTD_llt_none) goto LAB_0064b2e4;
        psVar20->longLengthType = ZSTD_llt_matchLength;
        psVar20->longLengthPos = (U32)((ulong)((long)psVar5 - (long)psVar20->sequencesStart) >> 3);
      }
      psVar5->mlBase = (U16)(sVar10 + 1);
      psVar20->sequences = psVar5 + 1;
      uVar9 = local_fc;
      local_fc = uVar13;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy_dedicatedDictSearch_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 1, ZSTD_dedicatedDictSearch);
}